

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int js_parse_template(JSParseState *s,int call,int *argc)

{
  JSToken *token;
  anon_union_32_4_06729a41_for_u *paVar1;
  int iVar2;
  JSContext *pJVar3;
  JSShape *pJVar4;
  JSValue val;
  bool bVar5;
  JSParseState *pJVar6;
  ulong uVar7;
  int iVar8;
  JSValueUnion JVar9;
  uint uVar10;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong uVar11;
  ulong extraout_RDX_04;
  ulong extraout_RDX_05;
  ulong extraout_RDX_06;
  ulong extraout_RDX_07;
  ulong extraout_RDX_08;
  ulong extraout_RDX_09;
  int64_t extraout_RDX_10;
  int64_t iVar12;
  JSParseState *s_00;
  JSValueUnion JVar13;
  uint8_t *p_00;
  char cVar14;
  JSValue this_obj;
  JSValue this_obj_00;
  JSValue v;
  JSValue v_00;
  JSValue obj;
  JSValue obj_00;
  JSValue val_00;
  JSValue JVar15;
  JSValue prop;
  JSValue prop_00;
  uint8_t *p;
  uint local_bc;
  JSValueUnion local_b8;
  ulong uStack_b0;
  JSParseState *local_a8;
  int local_9c;
  JSContext *local_98;
  JSValueUnion local_90;
  JSValueUnion local_88;
  uint8_t *puStack_80;
  int32_t local_78;
  undefined4 uStack_74;
  ulong uStack_70;
  JSValueUnion local_68;
  int64_t iStack_60;
  int64_t local_50;
  uint8_t *local_48;
  int *local_40;
  int64_t local_38;
  
  pJVar3 = s->ctx;
  local_a8 = s;
  local_9c = call;
  if (call == 0) {
    val_00 = (JSValue)(ZEXT816(3) << 0x40);
    local_90.float64 = 0.0;
    local_50 = 3;
  }
  else {
    pJVar4 = pJVar3->array_shape;
    (pJVar4->header).ref_count = (pJVar4->header).ref_count + 1;
    val_00 = JS_NewObjectFromShape(pJVar3,pJVar4,2);
    local_88 = val_00.u;
    if ((uint)val_00.tag == 6) {
      return -1;
    }
    iVar8 = emit_push_const(s,val_00,0);
    if ((0xfffffff4 < (uint)val_00.tag) &&
       (iVar2 = *local_88.ptr, *(int *)local_88.ptr = iVar2 + -1, iVar2 < 2)) {
      __JS_FreeValueRT(pJVar3->rt,val_00);
    }
    if (iVar8 != 0) {
      return -1;
    }
    pJVar4 = pJVar3->array_shape;
    (pJVar4->header).ref_count = (pJVar4->header).ref_count + 1;
    JVar15 = JS_NewObjectFromShape(pJVar3,pJVar4,2);
    local_50 = JVar15.tag;
    local_90 = JVar15.u;
    if ((int)JVar15.tag == 6) {
      return -1;
    }
    iVar8 = JS_DefinePropertyValue(pJVar3,val_00,0x70,JVar15,0x4000);
    if (iVar8 < 0) {
      return -1;
    }
  }
  pJVar6 = local_a8;
  local_38 = val_00.tag;
  token = &local_a8->token;
  local_bc = 0;
  s_00 = local_a8;
  local_98 = pJVar3;
  local_40 = argc;
  do {
    if (token->val != -0x7e) {
      iVar8 = js_parse_expect(s_00,-0x7e);
      return iVar8;
    }
    p_00 = (s_00->token).ptr + 1;
    local_88 = *(JSValueUnion *)token;
    puStack_80 = (pJVar6->token).ptr;
    JVar13 = (pJVar6->token).u.str.str.u;
    uStack_70 = *(ulong *)((long)&(pJVar6->token).u + 8);
    local_68 = (pJVar6->token).u.regexp.flags.u;
    iStack_60 = (pJVar6->token).u.regexp.flags.tag;
    local_78 = JVar13.int32;
    uStack_74 = JVar13._4_4_;
    local_48 = p_00;
    if (local_9c == 0) {
      paVar1 = &(s_00->token).u;
      local_b8 = (JSValueUnion)*(JSValueUnion *)paVar1;
      JVar15 = (paVar1->str).str;
      if ((0xfffffff4 < (uint)(s_00->token).u.str.str.tag) &&
         (uVar10 = *local_b8.ptr, *(uint *)local_b8.ptr = uVar10 - 1, (int)uVar10 < 2)) {
        __JS_FreeValueRT(local_98->rt,JVar15);
      }
      (s_00->token).u.ident.atom = 0;
      (s_00->token).u.str.str.tag = 3;
      cVar14 = '\x01';
      iVar8 = js_parse_string(s_00,0x60,1,p_00,(JSToken *)&local_88,&local_48);
      uVar7 = uStack_70;
      if (iVar8 == 0) {
        uVar10 = (uint)uStack_70;
        if (((*(uint *)(CONCAT44(uStack_74,local_78) + 4) & 0x7fffffff) == 0) && (local_bc != 0)) {
          pJVar3 = s_00->ctx;
          local_b8._4_4_ = uStack_74;
          local_b8.int32 = local_78;
          uVar11 = uStack_70;
          if ((0xfffffff4 < uVar10) &&
             (uVar10 = *local_b8.ptr, *(uint *)local_b8.ptr = uVar10 - 1, (int)uVar10 < 2)) {
            v.tag = uStack_70;
            v.u.float64 = local_b8.float64;
            __JS_FreeValueRT(pJVar3->rt,v);
            uVar11 = extraout_RDX_02;
          }
        }
        else {
          JVar13._4_4_ = uStack_74;
          JVar13.int32 = local_78;
          JVar15.u._4_4_ = uStack_74;
          JVar15.u.int32 = local_78;
          JVar15.tag = uStack_70;
          iVar8 = emit_push_const(s_00,JVar15,1);
          pJVar3 = s_00->ctx;
          uVar11 = extraout_RDX_03;
          local_b8 = JVar13;
          if (0xfffffff4 < uVar10) {
            uVar10 = *JVar13.ptr;
            uVar11 = (ulong)uVar10;
            *(uint *)JVar13.ptr = uVar10 - 1;
            if ((int)uVar10 < 2) {
              v_00.tag = uVar7;
              v_00.u.float64 = JVar13.float64;
              __JS_FreeValueRT(pJVar3->rt,v_00);
              uVar11 = extraout_RDX_04;
            }
          }
          s_00 = local_a8;
          if (iVar8 != 0) {
            bVar5 = false;
            goto LAB_0015c6cb;
          }
          if (local_bc == 0) {
            if ((local_a8->token).u.str.sep == 0x60) {
              bVar5 = false;
              cVar14 = '\x04';
              local_bc = 0;
              goto LAB_0015c6cb;
            }
            emit_op(local_a8,'B');
            local_b8.int32 = 0x5c;
            dbuf_put(&s_00->cur_func->byte_code,(uint8_t *)&local_b8.int32,4);
            uVar11 = extraout_RDX_05;
          }
          local_bc = local_bc + 1;
        }
        cVar14 = '\0';
        bVar5 = true;
      }
      else {
        bVar5 = false;
        uVar11 = extraout_RDX_00;
      }
LAB_0015c6cb:
      if (bVar5) {
LAB_0015c6d3:
        cVar14 = '\x05';
        if ((s_00->token).u.str.sep != 0x60) {
          iVar8 = next_token(s_00);
          cVar14 = '\x01';
          uVar11 = extraout_RDX_06;
          if ((iVar8 == 0) && (iVar8 = js_parse_expr2(s_00,1), uVar11 = extraout_RDX_07, iVar8 == 0)
             ) {
            local_bc = local_bc + 1;
            if (token->val == 0x7d) {
              free_token(s_00,token);
              s_00->got_lf = 0;
              s_00->last_line_num = (s_00->token).line_num;
              iVar8 = js_parse_template_part(s_00,s_00->buf_ptr);
              cVar14 = iVar8 != 0;
              uVar11 = extraout_RDX_09;
            }
            else {
              js_parse_error(s_00,"expected \'}\' after template expression");
              uVar11 = extraout_RDX_08;
            }
          }
        }
      }
    }
    else {
      paVar1 = &(s_00->token).u;
      local_b8 = *(JSValueUnion *)paVar1;
      uStack_b0 = (s_00->token).u.str.str.tag;
      JVar15 = (paVar1->str).str;
      if (0xfffffff4 < (uint)uStack_b0) {
        *(uint *)local_b8.ptr = *local_b8.ptr + 1;
      }
      JVar9._4_4_ = 0;
      JVar9.int32 = local_bc;
      JVar13.float64 = (double)JVar9.float64;
      if (-1 < (int)local_bc) {
        JVar13 = JVar9;
      }
      iVar12 = 7;
      if (-1 < (int)local_bc) {
        iVar12 = 0;
      }
      this_obj.tag = local_50;
      this_obj.u.ptr = local_90.ptr;
      prop.tag = iVar12;
      prop.u.float64 = JVar13.float64;
      iVar8 = JS_DefinePropertyValueValue(local_98,this_obj,prop,JVar15,0x4004);
      cVar14 = '\x01';
      uVar11 = extraout_RDX;
      s_00 = local_a8;
      if (-1 < iVar8) {
        iVar8 = js_parse_string(local_a8,0x60,0,p_00,(JSToken *)&local_88,&local_48);
        if (iVar8 != 0) {
          local_78 = 0;
          uStack_70 = 3;
        }
        local_b8._4_4_ = uStack_74;
        local_b8.int32 = local_78;
        uStack_b0 = uStack_70;
        val.u._4_4_ = uStack_74;
        val.u.int32 = local_78;
        val.tag = uStack_70;
        this_obj_00.tag = local_38;
        this_obj_00.u.ptr = val_00.u.ptr;
        prop_00.tag = iVar12;
        prop_00.u.float64 = JVar13.float64;
        iVar8 = JS_DefinePropertyValueValue(local_98,this_obj_00,prop_00,val,0x4004);
        uVar11 = extraout_RDX_01;
        s_00 = local_a8;
        if (-1 < iVar8) goto LAB_0015c6d3;
      }
    }
    pJVar3 = local_98;
    if (cVar14 != '\0') {
      if (cVar14 != '\x04') {
        if (cVar14 != '\x05') {
          return -1;
        }
        if (local_9c == 0) {
          emit_op(s_00,'$');
          local_b8.int32._0_2_ = (short)local_bc + -1;
          dbuf_put(&s_00->cur_func->byte_code,(uint8_t *)&local_b8.int32,2);
        }
        else {
          obj.tag = uVar11;
          obj.u.ptr = local_90.ptr;
          seal_template_obj(local_98,obj);
          obj_00.tag = extraout_RDX_10;
          obj_00.u.ptr = val_00.u.ptr;
          seal_template_obj(pJVar3,obj_00);
          *local_40 = local_bc + 1;
        }
      }
      iVar8 = next_token(s_00);
      return iVar8;
    }
  } while( true );
}

Assistant:

static __exception int js_parse_template(JSParseState *s, int call, int *argc)
{
    JSContext *ctx = s->ctx;
    JSValue raw_array, template_object;
    JSToken cooked;
    int depth, ret;

    raw_array = JS_UNDEFINED; /* avoid warning */
    template_object = JS_UNDEFINED; /* avoid warning */
    if (call) {
        /* Create a template object: an array of cooked strings */
        /* Create an array of raw strings and store it to the raw property */
        template_object = JS_NewArray(ctx);
        if (JS_IsException(template_object))
            return -1;
        //        pool_idx = s->cur_func->cpool_count;
        ret = emit_push_const(s, template_object, 0);
        JS_FreeValue(ctx, template_object);
        if (ret)
            return -1;
        raw_array = JS_NewArray(ctx);
        if (JS_IsException(raw_array))
            return -1;
        if (JS_DefinePropertyValue(ctx, template_object, JS_ATOM_raw,
                                   raw_array, JS_PROP_THROW) < 0) {
            return -1;
        }
    }

    depth = 0;
    while (s->token.val == TOK_TEMPLATE) {
        const uint8_t *p = s->token.ptr + 1;
        cooked = s->token;
        if (call) {
            if (JS_DefinePropertyValueUint32(ctx, raw_array, depth,
                                             JS_DupValue(ctx, s->token.u.str.str),
                                             JS_PROP_ENUMERABLE | JS_PROP_THROW) < 0) {
                return -1;
            }
            /* re-parse the string with escape sequences but do not throw a
               syntax error if it contains invalid sequences
             */
            if (js_parse_string(s, '`', FALSE, p, &cooked, &p)) {
                cooked.u.str.str = JS_UNDEFINED;
            }
            if (JS_DefinePropertyValueUint32(ctx, template_object, depth,
                                             cooked.u.str.str,
                                             JS_PROP_ENUMERABLE | JS_PROP_THROW) < 0) {
                return -1;
            }
        } else {
            JSString *str;
            /* re-parse the string with escape sequences and throw a
               syntax error if it contains invalid sequences
             */
            JS_FreeValue(ctx, s->token.u.str.str);
            s->token.u.str.str = JS_UNDEFINED;
            if (js_parse_string(s, '`', TRUE, p, &cooked, &p))
                return -1;
            str = JS_VALUE_GET_STRING(cooked.u.str.str);
            if (str->len != 0 || depth == 0) {
                ret = emit_push_const(s, cooked.u.str.str, 1);
                JS_FreeValue(s->ctx, cooked.u.str.str);
                if (ret)
                    return -1;
                if (depth == 0) {
                    if (s->token.u.str.sep == '`')
                        goto done1;
                    emit_op(s, OP_get_field2);
                    emit_atom(s, JS_ATOM_concat);
                }
                depth++;
            } else {
                JS_FreeValue(s->ctx, cooked.u.str.str);
            }
        }
        if (s->token.u.str.sep == '`')
            goto done;
        if (next_token(s))
            return -1;
        if (js_parse_expr(s))
            return -1;
        depth++;
        if (s->token.val != '}') {
            return js_parse_error(s, "expected '}' after template expression");
        }
        /* XXX: should convert to string at this stage? */
        free_token(s, &s->token);
        /* Resume TOK_TEMPLATE parsing (s->token.line_num and
         * s->token.ptr are OK) */
        s->got_lf = FALSE;
        s->last_line_num = s->token.line_num;
        if (js_parse_template_part(s, s->buf_ptr))
            return -1;
    }
    return js_parse_expect(s, TOK_TEMPLATE);

 done:
    if (call) {
        /* Seal the objects */
        seal_template_obj(ctx, raw_array);
        seal_template_obj(ctx, template_object);
        *argc = depth + 1;
    } else {
        emit_op(s, OP_call_method);
        emit_u16(s, depth - 1);
    }
 done1:
    return next_token(s);
}